

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O0

void lws_h2_set_bin(lws *wsi,int n,uchar *buf)

{
  uchar *buf_local;
  int n_local;
  lws *wsi_local;
  
  *buf = (uchar)((uint)n >> 8);
  buf[1] = (uchar)n;
  buf[2] = (uchar)((((wsi->h2).h2n)->our_set).s[n] >> 0x18);
  buf[3] = (uchar)((((wsi->h2).h2n)->our_set).s[n] >> 0x10);
  buf[4] = (uchar)((((wsi->h2).h2n)->our_set).s[n] >> 8);
  buf[5] = (uchar)(((wsi->h2).h2n)->our_set).s[n];
  return;
}

Assistant:

static void lws_h2_set_bin(struct lws *wsi, int n, unsigned char *buf)
{
	*buf++ = n >> 8;
	*buf++ = n;
	*buf++ = wsi->h2.h2n->our_set.s[n] >> 24;
	*buf++ = wsi->h2.h2n->our_set.s[n] >> 16;
	*buf++ = wsi->h2.h2n->our_set.s[n] >> 8;
	*buf = wsi->h2.h2n->our_set.s[n];
}